

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O0

int asio_service_test::auto_forwarding_test(bool async)

{
  initializer_list<RaftAsioPkg_*> __l;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  void *pvVar6;
  reference pvVar7;
  reference this;
  ulong uVar8;
  element_type *this_00;
  TestSm *pTVar9;
  element_type *peVar10;
  int __how;
  int __how_00;
  int __how_01;
  byte in_DIL;
  allocator<char> *this_01;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar11;
  size_t _v_4;
  size_t _ev_1;
  uint64_t val;
  buffer_serializer bs;
  int _v_3;
  int _ev;
  ptr<buffer> h_result;
  shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
  *handler;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
  *__range2;
  lock_guard<std::mutex> l;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> commit_results;
  int _gt;
  int _sm;
  string test_msg;
  size_t ii_2;
  int _v_2;
  size_t ii_1;
  size_t ii;
  vector<MsgArgs,_std::allocator<MsgArgs>_> m_args;
  vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> th;
  size_t NUM_PARALLEL_MSGS;
  anon_class_24_3_1757821c send_msg;
  list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
  handlers;
  mutex handlers_lock;
  raft_params param;
  RaftAsioPkg *pp;
  RaftAsioPkg **entry;
  iterator __end1;
  iterator __begin1;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *__range1;
  int _v_1;
  int _v;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  RaftAsioPkg s3;
  RaftAsioPkg s2;
  RaftAsioPkg s1;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  string *in_stack_ffffffffffffebc8;
  allocator *msg;
  RaftAsioPkg *in_stack_ffffffffffffebd0;
  anon_class_24_3_1757821c *in_stack_ffffffffffffebd8;
  raft_server *in_stack_ffffffffffffebe0;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
  *in_stack_ffffffffffffebe8;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffebf0;
  allocator_type *in_stack_ffffffffffffebf8;
  buffer_serializer *in_stack_ffffffffffffec00;
  ThreadExitHandler *in_stack_ffffffffffffec08;
  ThreadFunc *in_stack_ffffffffffffec10;
  ThreadArgs *in_stack_ffffffffffffec18;
  ThreadHolder *in_stack_ffffffffffffec20;
  raft_params *in_stack_ffffffffffffec38;
  raft_server *in_stack_ffffffffffffec40;
  string *in_stack_ffffffffffffec70;
  TestSm *in_stack_ffffffffffffec78;
  undefined8 in_stack_ffffffffffffed18;
  undefined1 check_precommit;
  TestSm *in_stack_ffffffffffffed20;
  TestSm *in_stack_ffffffffffffed28;
  init_options *in_stack_ffffffffffffeda8;
  undefined8 in_stack_ffffffffffffedb0;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *in_stack_ffffffffffffedb8;
  undefined7 in_stack_ffffffffffffedc8;
  undefined1 in_stack_ffffffffffffedcf;
  allocator local_8f1;
  string local_8f0 [32];
  native_handle_type local_8d0;
  char local_8c5;
  int local_8c4;
  string local_8c0 [32];
  native_handle_type local_8a0;
  char local_895;
  int local_894;
  string local_890 [32];
  native_handle_type local_870;
  char local_865;
  int local_864;
  string local_860 [32];
  size_type local_840;
  size_type local_838;
  _Base_ptr local_830;
  undefined1 local_828;
  uint64_t local_820;
  native_handle_type local_800;
  char local_7f5;
  int local_7f4;
  string local_7f0 [32];
  int local_7d0;
  int local_7cc;
  native_handle_type local_7c8;
  char local_7bd;
  int local_7bc;
  string local_7b8 [32];
  __shared_ptr local_798 [16];
  reference local_788;
  _Self local_780;
  _Self local_778;
  undefined1 *local_770;
  native_handle_type local_730;
  char local_725;
  int local_724;
  string local_720 [32];
  int local_700;
  int local_6fc;
  string local_6f8 [32];
  string local_6d8 [32];
  ulong local_6b8;
  native_handle_type local_6b0;
  char local_6a5;
  int local_6a4;
  string local_6a0 [36];
  int local_67c;
  ulong local_678;
  allocator local_669;
  string local_668 [96];
  ulong local_608;
  vector<MsgArgs,_std::allocator<MsgArgs>_> local_5f8;
  vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> local_5d8;
  undefined8 local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  undefined1 local_5a0 [24];
  undefined1 local_588 [113];
  undefined1 local_517;
  undefined4 local_514;
  undefined4 local_508;
  RaftAsioPkg *local_4f8;
  reference local_4f0;
  RaftAsioPkg **local_4e8;
  __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
  local_4e0;
  undefined1 *local_4d8;
  native_handle_type local_4d0;
  char local_4c5;
  int local_4c4;
  string local_4c0 [32];
  int local_4a0;
  uint local_49c;
  native_handle_type local_498;
  char local_48d;
  int local_48c;
  string local_488 [80];
  int local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  undefined1 **local_418;
  undefined8 local_410;
  undefined1 local_408 [24];
  undefined1 local_3f0 [288];
  undefined1 local_2d0 [288];
  undefined1 local_1b0 [295];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [35];
  byte local_5;
  int local_4;
  
  local_5 = in_DIL & 1;
  raft_functional_common::reset_log_files();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"tcp://127.0.0.1:20010",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"tcp://127.0.0.1:20020",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"tcp://127.0.0.1:20030",&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  RaftAsioPkg::RaftAsioPkg
            ((RaftAsioPkg *)in_stack_ffffffffffffebe0,
             (int)((ulong)in_stack_ffffffffffffebd8 >> 0x20),(string *)in_stack_ffffffffffffebd0);
  RaftAsioPkg::RaftAsioPkg
            ((RaftAsioPkg *)in_stack_ffffffffffffebe0,
             (int)((ulong)in_stack_ffffffffffffebd8 >> 0x20),(string *)in_stack_ffffffffffffebd0);
  RaftAsioPkg::RaftAsioPkg
            ((RaftAsioPkg *)in_stack_ffffffffffffebe0,
             (int)((ulong)in_stack_ffffffffffffebd8 >> 0x20),(string *)in_stack_ffffffffffffebd0);
  local_430 = local_1b0;
  local_428 = local_2d0;
  local_420 = local_3f0;
  local_418 = &local_430;
  local_410 = 3;
  std::allocator<RaftAsioPkg_*>::allocator((allocator<RaftAsioPkg_*> *)0x1bec0d);
  __l._M_len = (size_type)in_stack_ffffffffffffec10;
  __l._M_array = (iterator)in_stack_ffffffffffffec08;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)in_stack_ffffffffffffec00,__l,
             in_stack_ffffffffffffebf8);
  std::allocator<RaftAsioPkg_*>::~allocator((allocator<RaftAsioPkg_*> *)0x1bec41);
  TestSuite::_msg("launching asio-raft servers\n");
  nuraft::raft_server::init_options::init_options((init_options *)in_stack_ffffffffffffebd0);
  iVar3 = launch_servers(in_stack_ffffffffffffedb8,SUB81((ulong)in_stack_ffffffffffffedb0 >> 0x38,0)
                         ,SUB81((ulong)in_stack_ffffffffffffedb0 >> 0x30,0),
                         SUB81((ulong)in_stack_ffffffffffffedb0 >> 0x28,0),in_stack_ffffffffffffeda8
                        );
  nuraft::raft_server::init_options::~init_options((init_options *)0x1bec94);
  local_438 = iVar3;
  if (iVar3 == 0) {
    TestSuite::_msg("organizing raft group\n");
    local_4a0 = make_group((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                           CONCAT17(in_stack_ffffffffffffedcf,in_stack_ffffffffffffedc8));
    if (local_4a0 == 0) {
      local_4d8 = local_408;
      local_4e0._M_current =
           (RaftAsioPkg **)
           std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::begin
                     ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                      in_stack_ffffffffffffebc8);
      local_4e8 = (RaftAsioPkg **)
                  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::end
                            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                             in_stack_ffffffffffffebc8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                                 *)in_stack_ffffffffffffebd0,
                                (__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                                 *)in_stack_ffffffffffffebc8), bVar2) {
        local_4f0 = __gnu_cxx::
                    __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                    ::operator*(&local_4e0);
        local_4f8 = *local_4f0;
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1bf855);
        nuraft::raft_server::get_current_params(in_stack_ffffffffffffebe0);
        local_517 = 1;
        local_514 = 2;
        if ((local_5 & 1) != 0) {
          local_508 = 1;
        }
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1bf8a0);
        nuraft::raft_server::update_params(in_stack_ffffffffffffec40,in_stack_ffffffffffffec38);
        __gnu_cxx::
        __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
        ::operator++(&local_4e0);
      }
      std::mutex::mutex((mutex *)0x1bf8db);
      std::__cxx11::
      list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
      ::list((list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
              *)0x1bf8f0);
      local_5b8 = local_2d0;
      local_5c0 = 0x14;
      local_5b0 = local_588;
      local_5a8 = local_5a0;
      std::allocator<TestSuite::ThreadHolder>::allocator
                ((allocator<TestSuite::ThreadHolder> *)0x1bf941);
      std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::vector
                ((vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> *)
                 in_stack_ffffffffffffebf0,(size_type)in_stack_ffffffffffffebe8,
                 (allocator_type *)in_stack_ffffffffffffebe0);
      std::allocator<TestSuite::ThreadHolder>::~allocator
                ((allocator<TestSuite::ThreadHolder> *)0x1bf96a);
      std::allocator<MsgArgs>::allocator((allocator<MsgArgs> *)0x1bf97f);
      std::vector<MsgArgs,_std::allocator<MsgArgs>_>::vector
                ((vector<MsgArgs,_std::allocator<MsgArgs>_> *)in_stack_ffffffffffffebf0,
                 (size_type)in_stack_ffffffffffffebe8,(allocator_type *)in_stack_ffffffffffffebe0);
      std::allocator<MsgArgs>::~allocator((allocator<MsgArgs> *)0x1bf9a8);
      for (local_608 = 0; uVar1 = local_608, local_608 < 0x14; local_608 = local_608 + 1) {
        pvVar7 = std::vector<MsgArgs,_std::allocator<MsgArgs>_>::operator[](&local_5f8,local_608);
        pvVar7->ii = uVar1;
        std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::operator[]
                  (&local_5d8,local_608);
        std::vector<MsgArgs,_std::allocator<MsgArgs>_>::operator[](&local_5f8,local_608);
        std::function<int(TestSuite::ThreadArgs*)>::
        function<asio_service_test::auto_forwarding_test(bool)::__0&,void>
                  ((function<int_(TestSuite::ThreadArgs_*)> *)in_stack_ffffffffffffebe0,
                   in_stack_ffffffffffffebd8);
        std::function<void_(TestSuite::ThreadArgs_*)>::function
                  ((function<void_(TestSuite::ThreadArgs_*)> *)in_stack_ffffffffffffebd0,
                   in_stack_ffffffffffffebc8);
        TestSuite::ThreadHolder::spawn
                  (in_stack_ffffffffffffec20,in_stack_ffffffffffffec18,in_stack_ffffffffffffec10,
                   in_stack_ffffffffffffec08);
        std::function<void_(TestSuite::ThreadArgs_*)>::~function
                  ((function<void_(TestSuite::ThreadArgs_*)> *)0x1bfa91);
        std::function<int_(TestSuite::ThreadArgs_*)>::~function
                  ((function<int_(TestSuite::ThreadArgs_*)> *)0x1bfa9e);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_668,"replication",&local_669);
      TestSuite::sleep_sec((size_t)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
      std::__cxx11::string::~string(local_668);
      std::allocator<char>::~allocator((allocator<char> *)&local_669);
      for (local_678 = 0; local_678 < 0x14; local_678 = local_678 + 1) {
        std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::operator[]
                  (&local_5d8,local_678);
        TestSuite::ThreadHolder::join
                  ((ThreadHolder *)in_stack_ffffffffffffebe0,
                   SUB81((ulong)in_stack_ffffffffffffebd8 >> 0x38,0));
        this = std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::
               operator[](&local_5d8,local_678);
        local_67c = TestSuite::ThreadHolder::getResult(this);
        if (local_67c != 0) {
          poVar4 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(poVar4,"        time: ");
          poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar4 = std::operator<<(poVar4,local_6a0);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"      thread: ");
          poVar4 = std::operator<<(poVar4,"\x1b[33m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
          local_6a4 = (int)std::setw(4);
          poVar4 = std::operator<<(poVar4,(_Setw)local_6a4);
          local_6a5 = (char)std::setfill<char>('0');
          poVar4 = std::operator<<(poVar4,local_6a5);
          local_6b0 = (native_handle_type)std::this_thread::get_id();
          sVar5 = std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)in_stack_ffffffffffffebd0,
                             (id *)in_stack_ffffffffffffebc8);
          pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
          poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"          in: ");
          poVar4 = std::operator<<(poVar4,"\x1b[36m");
          poVar4 = std::operator<<(poVar4,"auto_forwarding_test");
          poVar4 = std::operator<<(poVar4,"()\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"          at: ");
          poVar4 = std::operator<<(poVar4,"\x1b[32m");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                  );
          poVar4 = std::operator<<(poVar4,"\x1b[0m:");
          poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5b7);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mth[ii].getResult()\x1b[0m\n");
          poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
          poVar4 = std::operator<<(poVar4,"0");
          poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
          poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_67c);
          std::operator<<(poVar4,"\x1b[0m\n");
          std::__cxx11::string::~string(local_6a0);
          TestSuite::failHandler();
          local_4 = -1;
          local_49c = 1;
          goto LAB_001c248e;
        }
      }
      for (local_6b8 = 0; local_6b8 < 0x14; local_6b8 = local_6b8 + 1) {
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffec08);
        std::operator+((char *)in_stack_ffffffffffffebd8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffebd0);
        std::__cxx11::string::~string(local_6f8);
        local_6fc = 0;
        RaftAsioPkg::getTestSm((RaftAsioPkg *)0x1c01df);
        uVar8 = raft_functional_common::TestSm::isCommitted
                          (in_stack_ffffffffffffec78,in_stack_ffffffffffffec70);
        local_700 = (int)uVar8;
        bVar2 = local_700 <= local_6fc;
        if (bVar2) {
          poVar4 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(poVar4,"        time: ");
          poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar4 = std::operator<<(poVar4,local_720);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"      thread: ");
          poVar4 = std::operator<<(poVar4,"\x1b[33m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
          local_724 = (int)std::setw(4);
          poVar4 = std::operator<<(poVar4,(_Setw)local_724);
          local_725 = (char)std::setfill<char>('0');
          poVar4 = std::operator<<(poVar4,local_725);
          local_730 = (native_handle_type)std::this_thread::get_id();
          sVar5 = std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)in_stack_ffffffffffffebd0,
                             (id *)in_stack_ffffffffffffebc8);
          pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
          poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"          in: ");
          poVar4 = std::operator<<(poVar4,"\x1b[36m");
          poVar4 = std::operator<<(poVar4,"auto_forwarding_test");
          poVar4 = std::operator<<(poVar4,"()\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"          at: ");
          poVar4 = std::operator<<(poVar4,"\x1b[32m");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                  );
          poVar4 = std::operator<<(poVar4,"\x1b[0m:");
          poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5bd);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"    expected: ");
          poVar4 = std::operator<<(poVar4,
                                   "\x1b[1;34ms1.getTestSm()->isCommitted(test_msg) > 0\x1b[0m\n");
          poVar4 = std::operator<<(poVar4,"    value of ");
          poVar4 = std::operator<<(poVar4,"\x1b[1;32ms1.getTestSm()->isCommitted(test_msg)\x1b[0m: "
                                  );
          poVar4 = std::operator<<(poVar4,"\x1b[1;31m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_700);
          poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
          poVar4 = std::operator<<(poVar4,"    value of ");
          poVar4 = std::operator<<(poVar4,"\x1b[1;32m0\x1b[0m: ");
          poVar4 = std::operator<<(poVar4,"\x1b[1;31m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6fc);
          std::operator<<(poVar4,"\x1b[0m\n");
          std::__cxx11::string::~string(local_720);
          TestSuite::failHandler();
          local_4 = -1;
        }
        local_49c = (uint)bVar2;
        std::__cxx11::string::~string(local_6d8);
        if (local_49c != 0) goto LAB_001c248e;
      }
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 0x1c0831);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_ffffffffffffebd0,
                 (mutex_type *)in_stack_ffffffffffffebc8);
      local_770 = local_5a0;
      local_778._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
           ::begin((list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
                    *)in_stack_ffffffffffffebc8);
      local_780._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
           ::end((list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
                  *)in_stack_ffffffffffffebc8);
      while( true ) {
        bVar2 = std::operator!=(&local_778,&local_780);
        check_precommit = (undefined1)((ulong)in_stack_ffffffffffffed18 >> 0x38);
        if (!bVar2) break;
        local_788 = std::
                    _List_iterator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>
                    ::operator*((_List_iterator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>
                                 *)0x1c08ad);
        std::
        __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1c08c2);
        nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::get
                  (in_stack_ffffffffffffebe8);
        std::shared_ptr<nuraft::buffer>::shared_ptr
                  ((shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffebd0,
                   (shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffebc8);
        bVar2 = std::__shared_ptr::operator_cast_to_bool(local_798);
        if (bVar2) {
          local_7cc = 8;
          this_00 = std::
                    __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1c0e38);
          sVar5 = nuraft::buffer::size(this_00);
          local_7d0 = (int)sVar5;
          if (local_7cc == local_7d0) {
            nuraft::buffer_serializer::buffer_serializer
                      ((buffer_serializer *)in_stack_ffffffffffffebe0,
                       (ptr<buffer> *)in_stack_ffffffffffffebd8,
                       (endianness)((ulong)in_stack_ffffffffffffebd0 >> 0x20));
            local_820 = nuraft::buffer_serializer::get_u64(in_stack_ffffffffffffec00);
            pVar11 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     insert(in_stack_ffffffffffffebf0,(value_type *)in_stack_ffffffffffffebe8);
            local_830 = (_Base_ptr)pVar11.first._M_node;
            local_828 = pVar11.second;
            local_49c = 0;
          }
          else {
            poVar4 = (ostream *)
                     std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            poVar4 = std::operator<<(poVar4,"        time: ");
            poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar4 = std::operator<<(poVar4,local_7f0);
            poVar4 = std::operator<<(poVar4,"\x1b[0m");
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"      thread: ");
            poVar4 = std::operator<<(poVar4,"\x1b[33m");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
            local_7f4 = (int)std::setw(4);
            poVar4 = std::operator<<(poVar4,(_Setw)local_7f4);
            local_7f5 = (char)std::setfill<char>('0');
            poVar4 = std::operator<<(poVar4,local_7f5);
            local_800 = (native_handle_type)std::this_thread::get_id();
            sVar5 = std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)in_stack_ffffffffffffebd0,
                               (id *)in_stack_ffffffffffffebc8);
            pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
            poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
            poVar4 = std::operator<<(poVar4,"\x1b[0m");
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"          in: ");
            poVar4 = std::operator<<(poVar4,"\x1b[36m");
            poVar4 = std::operator<<(poVar4,"auto_forwarding_test");
            poVar4 = std::operator<<(poVar4,"()\x1b[0m");
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"          at: ");
            poVar4 = std::operator<<(poVar4,"\x1b[32m");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                    );
            poVar4 = std::operator<<(poVar4,"\x1b[0m:");
            poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5c7);
            poVar4 = std::operator<<(poVar4,"\x1b[0m");
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mh_result->size()\x1b[0m\n");
            poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_7cc);
            poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
            poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_7d0);
            std::operator<<(poVar4,"\x1b[0m\n");
            std::__cxx11::string::~string(local_7f0);
            TestSuite::failHandler();
            local_4 = -1;
            local_49c = 1;
          }
        }
        else {
          poVar4 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(poVar4,"        time: ");
          poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar4 = std::operator<<(poVar4,local_7b8);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"      thread: ");
          poVar4 = std::operator<<(poVar4,"\x1b[33m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
          local_7bc = (int)std::setw(4);
          poVar4 = std::operator<<(poVar4,(_Setw)local_7bc);
          local_7bd = (char)std::setfill<char>('0');
          poVar4 = std::operator<<(poVar4,local_7bd);
          local_7c8 = (native_handle_type)std::this_thread::get_id();
          sVar5 = std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)in_stack_ffffffffffffebd0,
                             (id *)in_stack_ffffffffffffebc8);
          pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
          poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"          in: ");
          poVar4 = std::operator<<(poVar4,"\x1b[36m");
          poVar4 = std::operator<<(poVar4,"auto_forwarding_test");
          poVar4 = std::operator<<(poVar4,"()\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"          at: ");
          poVar4 = std::operator<<(poVar4,"\x1b[32m");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                  );
          poVar4 = std::operator<<(poVar4,"\x1b[0m:");
          poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5c6);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mh_result\x1b[0m\n");
          poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
          poVar4 = std::operator<<(poVar4,"non-NULL");
          poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
          poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
          poVar4 = std::operator<<(poVar4,"NULL");
          std::operator<<(poVar4,"\x1b[0m\n");
          std::__cxx11::string::~string(local_7b8);
          TestSuite::failHandler();
          local_4 = -1;
          local_49c = 1;
        }
        std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1c13e0);
        check_precommit = (undefined1)((ulong)in_stack_ffffffffffffed18 >> 0x38);
        if (local_49c != 0) goto LAB_001c192f;
        std::
        _List_iterator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>
        ::operator++(&local_778);
      }
      local_838 = 0x14;
      local_840 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x1c1430);
      if (local_838 == local_840) {
        local_49c = 0;
      }
      else {
        poVar4 = (ostream *)
                 std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"        time: ");
        poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar4 = std::operator<<(poVar4,local_860);
        poVar4 = std::operator<<(poVar4,"\x1b[0m");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"      thread: ");
        poVar4 = std::operator<<(poVar4,"\x1b[33m");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
        local_864 = (int)std::setw(4);
        poVar4 = std::operator<<(poVar4,(_Setw)local_864);
        local_865 = (char)std::setfill<char>('0');
        poVar4 = std::operator<<(poVar4,local_865);
        local_870 = (native_handle_type)std::this_thread::get_id();
        sVar5 = std::hash<std::thread::id>::operator()
                          ((hash<std::thread::id> *)in_stack_ffffffffffffebd0,
                           (id *)in_stack_ffffffffffffebc8);
        pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
        poVar4 = std::operator<<(poVar4,"\x1b[0m");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"          in: ");
        poVar4 = std::operator<<(poVar4,"\x1b[36m");
        poVar4 = std::operator<<(poVar4,"auto_forwarding_test");
        poVar4 = std::operator<<(poVar4,"()\x1b[0m");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"          at: ");
        poVar4 = std::operator<<(poVar4,"\x1b[32m");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                );
        poVar4 = std::operator<<(poVar4,"\x1b[0m:");
        poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5cd);
        poVar4 = std::operator<<(poVar4,"\x1b[0m");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mcommit_results.size()\x1b[0m\n");
        poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_838);
        poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
        poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_840);
        std::operator<<(poVar4,"\x1b[0m\n");
        std::__cxx11::string::~string(local_860);
        TestSuite::failHandler();
        local_4 = -1;
        local_49c = 1;
      }
LAB_001c192f:
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1c193c);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 0x1c1949);
      if (local_49c == 0) {
        RaftAsioPkg::getTestSm((RaftAsioPkg *)0x1c1967);
        RaftAsioPkg::getTestSm((RaftAsioPkg *)0x1c197e);
        bVar2 = raft_functional_common::TestSm::isSame
                          (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,(bool)check_precommit
                          );
        if (bVar2) {
          RaftAsioPkg::getTestSm((RaftAsioPkg *)0x1c1ebc);
          pTVar9 = RaftAsioPkg::getTestSm((RaftAsioPkg *)0x1c1ed3);
          iVar3 = (int)pTVar9;
          bVar2 = raft_functional_common::TestSm::isSame
                            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,
                             (bool)check_precommit);
          if (bVar2) {
            peVar10 = std::
                      __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1c2398);
            nuraft::raft_server::shutdown(peVar10,iVar3,__how);
            peVar10 = std::
                      __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1c23af);
            nuraft::raft_server::shutdown(peVar10,iVar3,__how_00);
            peVar10 = std::
                      __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1c23c6);
            nuraft::raft_server::shutdown(peVar10,iVar3,__how_01);
            msg = &local_8f1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_8f0,"shutting down",msg);
            iVar3 = (int)local_8f0;
            TestSuite::sleep_sec((size_t)in_stack_ffffffffffffebd0,(string *)msg);
            std::__cxx11::string::~string(local_8f0);
            this_01 = (allocator<char> *)&local_8f1;
            std::allocator<char>::~allocator(this_01);
            SimpleLogger::shutdown((int)this_01,iVar3);
            local_4 = 0;
            local_49c = 1;
          }
          else {
            poVar4 = (ostream *)
                     std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            poVar4 = std::operator<<(poVar4,"        time: ");
            poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar4 = std::operator<<(poVar4,local_8c0);
            poVar4 = std::operator<<(poVar4,"\x1b[0m");
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"      thread: ");
            poVar4 = std::operator<<(poVar4,"\x1b[33m");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
            local_8c4 = (int)std::setw(4);
            poVar4 = std::operator<<(poVar4,(_Setw)local_8c4);
            local_8c5 = (char)std::setfill<char>('0');
            poVar4 = std::operator<<(poVar4,local_8c5);
            local_8d0 = (native_handle_type)std::this_thread::get_id();
            sVar5 = std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)in_stack_ffffffffffffebd0,
                               (id *)in_stack_ffffffffffffebc8);
            pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
            poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
            poVar4 = std::operator<<(poVar4,"\x1b[0m");
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"          in: ");
            poVar4 = std::operator<<(poVar4,"\x1b[36m");
            poVar4 = std::operator<<(poVar4,"auto_forwarding_test");
            poVar4 = std::operator<<(poVar4,"()\x1b[0m");
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"          at: ");
            poVar4 = std::operator<<(poVar4,"\x1b[32m");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                    );
            poVar4 = std::operator<<(poVar4,"\x1b[0m:");
            poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5d2);
            poVar4 = std::operator<<(poVar4,"\x1b[0m");
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,
                                     "    value of: \x1b[1;34ms3.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                    );
            poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
            poVar4 = std::operator<<(poVar4,"true");
            in_stack_ffffffffffffebe0 = (raft_server *)std::operator<<(poVar4,"\x1b[0m\n");
            poVar4 = std::operator<<((ostream *)in_stack_ffffffffffffebe0,"      actual: \x1b[1;31m"
                                    );
            in_stack_ffffffffffffebd0 = (RaftAsioPkg *)std::operator<<(poVar4,"false");
            std::operator<<((ostream *)in_stack_ffffffffffffebd0,"\x1b[0m\n");
            std::__cxx11::string::~string(local_8c0);
            TestSuite::failHandler();
            local_4 = -1;
            local_49c = 1;
          }
        }
        else {
          poVar4 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(poVar4,"        time: ");
          poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar4 = std::operator<<(poVar4,local_890);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"      thread: ");
          poVar4 = std::operator<<(poVar4,"\x1b[33m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
          local_894 = (int)std::setw(4);
          poVar4 = std::operator<<(poVar4,(_Setw)local_894);
          local_895 = (char)std::setfill<char>('0');
          poVar4 = std::operator<<(poVar4,local_895);
          local_8a0 = (native_handle_type)std::this_thread::get_id();
          sVar5 = std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)in_stack_ffffffffffffebd0,
                             (id *)in_stack_ffffffffffffebc8);
          pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
          poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"          in: ");
          poVar4 = std::operator<<(poVar4,"\x1b[36m");
          poVar4 = std::operator<<(poVar4,"auto_forwarding_test");
          poVar4 = std::operator<<(poVar4,"()\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"          at: ");
          poVar4 = std::operator<<(poVar4,"\x1b[32m");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                  );
          poVar4 = std::operator<<(poVar4,"\x1b[0m:");
          poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5d1);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,
                                   "    value of: \x1b[1;34ms2.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                  );
          poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
          poVar4 = std::operator<<(poVar4,"true");
          poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
          poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
          poVar4 = std::operator<<(poVar4,"false");
          std::operator<<(poVar4,"\x1b[0m\n");
          std::__cxx11::string::~string(local_890);
          TestSuite::failHandler();
          local_4 = -1;
          local_49c = 1;
        }
      }
LAB_001c248e:
      std::vector<MsgArgs,_std::allocator<MsgArgs>_>::~vector
                ((vector<MsgArgs,_std::allocator<MsgArgs>_> *)in_stack_ffffffffffffebe0);
      std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::~vector
                ((vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> *)
                 in_stack_ffffffffffffebe0);
      std::__cxx11::
      list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
      ::~list((list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
               *)0x1c24b5);
    }
    else {
      poVar4 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"        time: ");
      poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,local_4c0);
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"      thread: ");
      poVar4 = std::operator<<(poVar4,"\x1b[33m");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
      local_4c4 = (int)std::setw(4);
      poVar4 = std::operator<<(poVar4,(_Setw)local_4c4);
      local_4c5 = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4,local_4c5);
      local_4d0 = (native_handle_type)std::this_thread::get_id();
      sVar5 = std::hash<std::thread::id>::operator()
                        ((hash<std::thread::id> *)in_stack_ffffffffffffebd0,
                         (id *)in_stack_ffffffffffffebc8);
      pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
      poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"          in: ");
      poVar4 = std::operator<<(poVar4,"\x1b[36m");
      poVar4 = std::operator<<(poVar4,"auto_forwarding_test");
      poVar4 = std::operator<<(poVar4,"()\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"          at: ");
      poVar4 = std::operator<<(poVar4,"\x1b[32m");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                              );
      poVar4 = std::operator<<(poVar4,"\x1b[0m:");
      poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x58b);
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mmake_group(pkgs)\x1b[0m\n");
      poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
      poVar4 = std::operator<<(poVar4,"0");
      poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
      poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_4a0);
      std::operator<<(poVar4,"\x1b[0m\n");
      std::__cxx11::string::~string(local_4c0);
      TestSuite::failHandler();
      local_4 = -1;
      local_49c = 1;
    }
  }
  else {
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"        time: ");
    poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_488);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"      thread: ");
    poVar4 = std::operator<<(poVar4,"\x1b[33m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
    local_48c = (int)std::setw(4);
    poVar4 = std::operator<<(poVar4,(_Setw)local_48c);
    local_48d = (char)std::setfill<char>('0');
    poVar4 = std::operator<<(poVar4,local_48d);
    local_498 = (native_handle_type)std::this_thread::get_id();
    sVar5 = std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)in_stack_ffffffffffffebd0,
                       (id *)in_stack_ffffffffffffebc8);
    pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"          in: ");
    poVar4 = std::operator<<(poVar4,"\x1b[36m");
    poVar4 = std::operator<<(poVar4,"auto_forwarding_test");
    poVar4 = std::operator<<(poVar4,"()\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"          at: ");
    poVar4 = std::operator<<(poVar4,"\x1b[32m");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar4 = std::operator<<(poVar4,"\x1b[0m:");
    poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x588);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mlaunch_servers(pkgs, false)\x1b[0m\n");
    poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
    poVar4 = std::operator<<(poVar4,"0");
    poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
    poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_438);
    std::operator<<(poVar4,"\x1b[0m\n");
    std::__cxx11::string::~string(local_488);
    TestSuite::failHandler();
    local_4 = -1;
    local_49c = 1;
  }
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::~vector
            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)in_stack_ffffffffffffebe0);
  RaftAsioPkg::~RaftAsioPkg(in_stack_ffffffffffffebd0);
  RaftAsioPkg::~RaftAsioPkg(in_stack_ffffffffffffebd0);
  RaftAsioPkg::~RaftAsioPkg(in_stack_ffffffffffffebd0);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  return local_4;
}

Assistant:

int auto_forwarding_test(bool async) {
    reset_log_files();

    std::string s1_addr = "tcp://127.0.0.1:20010";
    std::string s2_addr = "tcp://127.0.0.1:20020";
    std::string s3_addr = "tcp://127.0.0.1:20030";

    RaftAsioPkg s1(1, s1_addr);
    RaftAsioPkg s2(2, s2_addr);
    RaftAsioPkg s3(3, s3_addr);
    std::vector<RaftAsioPkg*> pkgs = {&s1, &s2, &s3};

    _msg("launching asio-raft servers\n");
    CHK_Z( launch_servers(pkgs, false) );

    _msg("organizing raft group\n");
    CHK_Z( make_group(pkgs) );

    // Set async.
    for (auto& entry: pkgs) {
        RaftAsioPkg* pp = entry;
        raft_params param = pp->raftServer->get_current_params();
        param.auto_forwarding_ = true;
        param.auto_forwarding_max_connections_ = 2;
        if (async) {
            param.return_method_ = raft_params::async_handler;
        }
        pp->raftServer->update_params(param);
    }

    // Append messages in parallel into S2 (follower).
    struct MsgArgs : TestSuite::ThreadArgs {
        size_t ii;
    };

    std::mutex handlers_lock;
    std::list< ptr< cmd_result< ptr<buffer> > > > handlers;
    auto send_msg = [&](TestSuite::ThreadArgs* t_args) -> int {
        MsgArgs* args = (MsgArgs*)t_args;
        std::string test_msg = "test" + std::to_string(args->ii);
        ptr<buffer> msg = buffer::alloc(test_msg.size() + 1);
        msg->put(test_msg);
        ptr< cmd_result< ptr<buffer> > > ret =
            s2.raftServer->append_entries( {msg} );

        std::lock_guard<std::mutex> l(handlers_lock);
        handlers.push_back(ret);
        return 0;
    };

    const size_t NUM_PARALLEL_MSGS = 20;
    std::vector<TestSuite::ThreadHolder> th(NUM_PARALLEL_MSGS);
    std::vector<MsgArgs> m_args(NUM_PARALLEL_MSGS);
    for (size_t ii = 0; ii < NUM_PARALLEL_MSGS; ++ii) {
        m_args[ii].ii = ii;
        th[ii].spawn(&m_args[ii], send_msg, nullptr);
    }
    TestSuite::sleep_sec(1, "replication");
    for (size_t ii = 0; ii < NUM_PARALLEL_MSGS; ++ii) {
        th[ii].join();
        CHK_Z(th[ii].getResult());
    }

    // All messages should have been committed in the state machine.
    for (size_t ii = 0; ii < NUM_PARALLEL_MSGS; ++ii) {
        std::string test_msg = "test" + std::to_string(ii);
        CHK_GT(s1.getTestSm()->isCommitted(test_msg), 0);
    }

    // All handlers should have the result.
    {
        std::set<uint64_t> commit_results;
        std::lock_guard<std::mutex> l(handlers_lock);
        for (auto& handler: handlers) {
            ptr<buffer> h_result = handler->get();
            CHK_NONNULL(h_result);
            CHK_EQ(8, h_result->size());
            buffer_serializer bs(h_result);
            uint64_t val = bs.get_u64();
            commit_results.insert(val);
        }
        // All messages should have delivered their results.
        CHK_EQ(NUM_PARALLEL_MSGS, commit_results.size());
    }

    // State machine should be identical.
    CHK_OK( s2.getTestSm()->isSame( *s1.getTestSm() ) );
    CHK_OK( s3.getTestSm()->isSame( *s1.getTestSm() ) );

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    return 0;
}